

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

RegexPattern * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CompileProgram<true>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node *root,
          EncodedChar **currentCharacter,CharCount totalLen,CharCount bodyChars,
          CharCount bodyEncodedChars,CharCount totalChars,RegexFlags flags)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  undefined4 *puVar4;
  Program *program;
  RegexPattern *pattern;
  RegexStatsDatabase *pRVar5;
  RegexStats *stats;
  DebugWriter *this_00;
  
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0xba5,"(IsLiteral)","IsLiteral");
  if (bVar2) {
    *puVar4 = 0;
    recycler = this->scriptContext->recycler;
    program = Program::New(recycler,flags);
    CaptureSourceAndGroups(this,recycler,program,*currentCharacter,bodyChars,bodyEncodedChars);
    *currentCharacter = *currentCharacter + totalLen;
    if ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits != (ulong)(totalLen - totalChars))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xbb1,"(GetMultiUnits() == totalLen - totalChars)",
                         "GetMultiUnits() == totalLen - totalChars");
      if (!bVar2) goto LAB_00ebfd59;
      *puVar4 = 0;
    }
    pattern = RegexPattern::New(this->scriptContext,program,true);
    if (DAT_015bc479 == '\x01') {
      pRVar5 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
      stats = RegexStatsDatabase::GetRegexStats(pRVar5,pattern);
      pRVar5 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
      RegexStatsDatabase::EndProfile(pRVar5,stats,Parse);
    }
    else {
      stats = (RegexStats *)0x0;
    }
    if (DAT_015bc478 == '\x01') {
      this_00 = Js::ScriptContext::GetRegexDebugWriter(this->scriptContext);
      DebugWriter::Print(this_00,L"// REGEX COMPILE ");
      RegexPattern::Print(pattern,this_00);
      DebugWriter::EOL(this_00);
    }
    if (DAT_015bc479 == '\x01') {
      pRVar5 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
      RegexStatsDatabase::BeginProfile(pRVar5);
    }
    Compiler::Compile(this->scriptContext,this->ctAllocator,&this->scriptContext->regexAllocator,
                      this->standardChars,program,root,this->litbuf,pattern,this->w,stats);
    if (DAT_015bc479 == '\x01') {
      pRVar5 = Js::ScriptContext::GetRegexStatsDatabase(this->scriptContext);
      RegexStatsDatabase::EndProfile(pRVar5,stats,Compile);
    }
    Js::ScriptContext::ProfileEnd(this->scriptContext,RegexCompilePhase);
    uVar3 = RegexPattern::NumGroups(pattern);
    if ((uVar3 != 0) && (uVar3 = RegexPattern::NumGroups(pattern), -1 < (short)uVar3)) {
      return pattern;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbe5,"(0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS)"
                       ,"0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS");
    if (bVar2) {
      *puVar4 = 0;
      return pattern;
    }
  }
LAB_00ebfd59:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RegexPattern * Parser<P, IsLiteral>::CompileProgram
        ( Node* root,
          const EncodedChar*& currentCharacter,
          const CharCount totalLen,
          const CharCount bodyChars,
          const CharCount bodyEncodedChars,
          const CharCount totalChars,
          const RegexFlags flags )
    {
        Assert(IsLiteral);

        Program* program = nullptr;

        if (buildAST)
        {
            const auto recycler = this->scriptContext->GetRecycler();
            program = Program::New(recycler, flags);
            this->CaptureSourceAndGroups(recycler, program, currentCharacter, bodyChars, bodyEncodedChars);
        }

        currentCharacter += totalLen;
        Assert(GetMultiUnits() == totalLen - totalChars);

        if (!buildAST)
        {
            return nullptr;
        }

        RegexPattern* pattern = RegexPattern::New(this->scriptContext, program, true);

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexStats* stats = 0;
        if (REGEX_CONFIG_FLAG(RegexProfile))
        {
            stats = this->scriptContext->GetRegexStatsDatabase()->GetRegexStats(pattern);
            this->scriptContext->GetRegexStatsDatabase()->EndProfile(stats, RegexStats::Parse);
        }
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            DebugWriter* tw = this->scriptContext->GetRegexDebugWriter();
            tw->Print(_u("// REGEX COMPILE "));
            pattern->Print(tw);
            tw->EOL();
        }
        if (REGEX_CONFIG_FLAG(RegexProfile))
            this->scriptContext->GetRegexStatsDatabase()->BeginProfile();
#endif

        ArenaAllocator* rtAllocator = this->scriptContext->RegexAllocator();
        Compiler::Compile
            ( this->scriptContext
              , ctAllocator
              , rtAllocator
              , standardChars
              , program
              , root
              , this->GetLitbuf()
              , pattern
#if ENABLE_REGEX_CONFIG_OPTIONS
              , w
              , stats
#endif
                );

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexProfile))
            this->scriptContext->GetRegexStatsDatabase()->EndProfile(stats, RegexStats::Compile);
#endif

#ifdef PROFILE_EXEC
        this->scriptContext->ProfileEnd(Js::RegexCompilePhase);
#endif
        // CaptureSourceAndGroups throws if this condition doesn't hold.
        Assert(0 < pattern->NumGroups() && pattern->NumGroups() <= MAX_NUM_GROUPS);

        return pattern;
    }